

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool container_contains(container_t *c,uint16_t val,uint8_t typecode)

{
  _Bool _Var1;
  uint uVar2;
  undefined7 in_register_00000011;
  
  uVar2 = (uint)CONCAT71(in_register_00000011,typecode);
  if (uVar2 == 4) {
    uVar2 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar2 != '\x03') {
    if ((uVar2 & 0xff) == 2) {
      _Var1 = array_container_contains((array_container_t *)c,val);
      return _Var1;
    }
    return (*(ulong *)(((array_container_t *)c)->array + (ulong)(val >> 6) * 4) >>
            ((ulong)val & 0x3f) & 1) != 0;
  }
  _Var1 = run_container_contains((run_container_t *)c,val);
  return _Var1;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}